

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool ON_ReparameterizeRationalNurbsCurve
               (double c,int dim,int order,int cv_count,int cvstride,double *cv,double *knot)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  double x;
  double dVar11;
  double dVar12;
  
  bVar3 = ON_IsValid(c);
  if (bVar3) {
    x = c + -1.0;
    bVar3 = ON_IsValid(x);
    if (c != 0.0 && bVar3) {
      if ((c != 1.0) || (NAN(c))) {
        dVar1 = knot[(long)order + -2];
        lVar4 = (long)cv_count;
        dVar2 = knot[lVar4 + -1];
        dVar11 = dVar2 - dVar1;
        bVar3 = ON_IsValid(dVar11);
        if (!bVar3) {
          return false;
        }
        if (dVar11 <= 0.0) {
          return false;
        }
        uVar5 = (order + cv_count) - 2;
        if (0 < (int)uVar5) {
          uVar6 = 0;
          do {
            dVar12 = (knot[uVar6] - dVar1) * (1.0 / dVar11);
            knot[uVar6] = (dVar12 * c) / (x * dVar12 + 1.0);
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        if (0 < cv_count) {
          iVar7 = 0;
          do {
            dVar11 = *knot * -x + c;
            lVar8 = (long)(order + -2);
            if (order + -2 != 0) {
              do {
                dVar11 = dVar11 * (knot[lVar8] * -x + c);
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
            }
            dVar12 = cv[dim];
            pdVar10 = cv;
            iVar9 = dim;
            if (dim != 0) {
              do {
                cv = pdVar10 + 1;
                *pdVar10 = *pdVar10 * dVar11;
                iVar9 = iVar9 + -1;
                pdVar10 = cv;
              } while (iVar9 != 0);
            }
            knot = knot + 1;
            *cv = dVar12 * dVar11;
            cv = cv + (long)(~dim + cvstride) + 1;
            iVar7 = iVar7 + 1;
          } while (iVar7 != cv_count);
        }
        if (0 < (int)uVar5) {
          uVar6 = 0;
          do {
            knot[uVar6 - lVar4] = (1.0 - knot[uVar6 - lVar4]) * dVar1 + knot[uVar6 - lVar4] * dVar2;
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ReparameterizeRationalNurbsCurve(
          double c, 
          int dim, 
          int order, 
          int cv_count,
          int cvstride,
          double* cv,
          double* knot
          )
{
  // Reference
  //  E. T. Y. Lee and M. L. Lucian 
  //  Mobius reparameterization of rational B-splines
  //  CAGD Vol8 pp 213-215 1991
  const double c1 = c-1.0;
  double k0, k1, k, d, w0, w1;
  int i,j;

  if ( !ON_IsValid(c) || !ON_IsValid(c1) || 0.0 == c )
    return false;

  if ( 1.0 == c )
    return true;

  // change domain to [0,1] and then adjust knots
  k0 = knot[order-2];
  k1 = knot[cv_count-1];
  d = k1 - k0;
  if ( !ON_IsValid(d) || d <= 0.0 )
    return false;
  d = 1.0/d;
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    k = (k - k0)*d;
    knot[i] = c*k/(c1*k+1.0);
  }

  // adjust cvs
  order -= 2;
  cvstride -= (dim+1);
  for ( i = 0; i < cv_count; i++ )
  {
    d = c - c1*(*knot++);
    j = order;
    while(j--)
    {
      d *= c - c1*knot[j];
    }
    w0 = cv[dim];
    w1 = w0*d;
    j = dim;
    while(j--)
      *cv++ *= d;
    *cv++ = w1;
    cv += cvstride;
  }
  order += 2;
  cvstride += (dim+1);
  cv -= cv_count*cvstride;
  knot -= cv_count;

  // change domain back to [k0,k1]
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    knot[i] = (1.0-k)*k0 + k*k1;
  }

  return true;
}